

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void __thiscall FNotifyBuffer::Tick(FNotifyBuffer *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  FNotifyText *pFVar4;
  uint uVar5;
  uint deletecount;
  
  iVar1 = this->Top;
  iVar3 = 1;
  if ((iVar1 < this->TopGoal) || (iVar3 = -1, this->TopGoal < iVar1)) {
    this->Top = iVar1 + iVar3;
  }
  uVar2 = (this->Text).Count;
  if (uVar2 == 0) {
    deletecount = 0;
  }
  else {
    pFVar4 = (this->Text).Array;
    uVar5 = 0;
    do {
      if ((pFVar4->TimeOut != 0) && (deletecount = uVar5, gametic < pFVar4->TimeOut)) break;
      uVar5 = uVar5 + 1;
      pFVar4 = pFVar4 + 1;
      deletecount = uVar2;
    } while (uVar2 != uVar5);
  }
  if (deletecount == 0) {
    return;
  }
  TArray<FNotifyText,_FNotifyText>::Delete(&this->Text,0,deletecount);
  return;
}

Assistant:

void FNotifyBuffer::Tick()
{
	if (TopGoal > Top)
	{
		Top++;
	}
	else if (TopGoal < Top)
	{
		Top--;
	}

	// Remove lines from the beginning that have expired.
	unsigned i;
	for (i = 0; i < Text.Size(); ++i)
	{
		if (Text[i].TimeOut != 0 && Text[i].TimeOut > gametic)
			break;
	}
	if (i > 0)
	{
		Text.Delete(0, i);
	}
}